

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitStringNew(BinaryInstWriter *this,StringNew *curr)

{
  StringNewOp SVar1;
  BufferWithRandomAccess *pBVar2;
  bool bVar3;
  U32LEB local_24;
  U32LEB local_20;
  U32LEB local_1c;
  StringNew *local_18;
  StringNew *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (StringNew *)this;
  bVar3 = wasm::Type::isNull(&curr->ref->type);
  if (bVar3) {
    emitUnreachable(this);
  }
  else {
    BufferWithRandomAccess::operator<<(this->o,-5);
    SVar1 = local_18->op;
    if (SVar1 == StringNewLossyUTF8Array) {
      pBVar2 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0xb4);
      BufferWithRandomAccess::operator<<(pBVar2,local_1c);
    }
    else if (SVar1 == StringNewWTF16Array) {
      pBVar2 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0xb1);
      BufferWithRandomAccess::operator<<(pBVar2,local_20);
    }
    else {
      if (SVar1 != StringNewFromCodePoint) {
        handle_unreachable("invalid string.new*",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x9fa);
      }
      pBVar2 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_24,0xa9);
      BufferWithRandomAccess::operator<<(pBVar2,local_24);
    }
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStringNew(StringNew* curr) {
  if (curr->ref->type.isNull()) {
    // This is a bottom type, so this is an array-receiving operation that does
    // not receive an array. The spec allows this, but V8 does not, see
    // https://github.com/WebAssembly/stringref/issues/66
    // For now, just emit an unreachable here as this will definitely trap.
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringNewLossyUTF8Array:
      o << U32LEB(BinaryConsts::StringNewLossyUTF8Array);
      break;
    case StringNewWTF16Array:
      o << U32LEB(BinaryConsts::StringNewWTF16Array);
      break;
    case StringNewFromCodePoint:
      o << U32LEB(BinaryConsts::StringFromCodePoint);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}